

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

_Bool extent_coalesce(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,ecache_t *ecache,edata_t *inner,
                     edata_t *outer,_Bool forward)

{
  edata_t *a;
  _Bool _Var1;
  edata_t *b;
  undefined1 holding_core_locks;
  eset_t *eset;
  
  holding_core_locks = SUB81(outer,0);
  duckdb_je_eset_remove(&ecache->eset,outer);
  b = inner;
  a = outer;
  if (forward) {
    b = outer;
    a = inner;
  }
  _Var1 = extent_merge_impl(tsdn,pac,ehooks,a,b,(_Bool)holding_core_locks);
  if (_Var1) {
    duckdb_je_emap_update_edata_state(tsdn,pac->emap,outer,ecache->state);
    eset = &ecache->guarded_eset;
    if (((uint)outer->e_bits >> 0x10 & 1) == 0) {
      eset = &ecache->eset;
    }
    duckdb_je_eset_insert(eset,outer);
  }
  return _Var1;
}

Assistant:

static bool
extent_coalesce(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks, ecache_t *ecache,
    edata_t *inner, edata_t *outer, bool forward) {
	extent_assert_can_coalesce(inner, outer);
	eset_remove(&ecache->eset, outer);

	bool err = extent_merge_impl(tsdn, pac, ehooks,
	    forward ? inner : outer, forward ? outer : inner,
	    /* holding_core_locks */ true);
	if (err) {
		extent_deactivate_check_state_locked(tsdn, pac, ecache, outer,
		    extent_state_merging);
	}

	return err;
}